

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_opt.c
# Opt level: O2

MPP_RET mpp_opt_add(MppOpt opt,MppOptInfo *info)

{
  long lVar1;
  MPP_RET MVar2;
  MppOptImpl *impl;
  
  if ((opt != (MppOpt)0x0) && (lVar1 = *(long *)((long)opt + 8), lVar1 != 0)) {
    if (info != (MppOptInfo *)0x0) {
      MVar2 = mpp_trie_add_info(lVar1,info->name,info,0x20);
      return MVar2;
    }
    MVar2 = mpp_trie_add_info(lVar1,0,0,0);
    return MVar2;
  }
  return MPP_NOK;
}

Assistant:

MPP_RET mpp_opt_add(MppOpt opt, MppOptInfo *info)
{
    MppOptImpl *impl = (MppOptImpl *)opt;

    if (NULL == impl || NULL == impl->trie)
        return MPP_NOK;

    if (NULL == info)
        return mpp_trie_add_info(impl->trie, NULL, NULL, 0);

    return mpp_trie_add_info(impl->trie, info->name, info, sizeof(*info));
}